

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O1

value_type * __thiscall nonstd::optional_lite::optional<int>::value(optional<int> *this)

{
  logic_error *this_00;
  bad_optional_access local_20;
  
  if (this->has_value_ != false) {
    return (value_type *)&this->contained;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  bad_optional_access::bad_optional_access(&local_20);
  std::logic_error::logic_error(this_00,&local_20.super_logic_error);
  *(undefined ***)this_00 = &PTR__logic_error_001b9d08;
  __cxa_throw(this_00,&bad_optional_access::typeinfo,std::logic_error::~logic_error);
}

Assistant:

optional_constexpr14 value_type const & value() const optional_ref_qual
    {
#if optional_CONFIG_NO_EXCEPTIONS
        assert( has_value() );
#else
        if ( ! has_value() )
        {
            throw bad_optional_access();
        }
#endif
        return contained.value();
    }